

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_list_un_complete_tasks.cc
# Opt level: O1

int __thiscall
aliyun::Drds::ListUnCompleteTasks
          (Drds *this,DrdsListUnCompleteTasksRequestType *req,
          DrdsListUnCompleteTasksResponseType *response,DrdsErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ArrayIndex AVar5;
  Int IVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  Value *pVVar12;
  size_type *psVar13;
  uint index;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  string local_458;
  Value local_438;
  vector<aliyun::DrdsListUnCompleteTaskstaskType,_std::allocator<aliyun::DrdsListUnCompleteTaskstaskType>_>
  *local_420;
  long *local_418;
  long local_410;
  long local_408 [2];
  string local_3f8;
  string local_3d8;
  undefined1 local_3b8 [32];
  _Alloc_hider local_398;
  size_type local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  size_type local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  Int local_358;
  _Alloc_hider local_350;
  size_type local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  Int local_330;
  _Alloc_hider local_328;
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  long local_308;
  _Alloc_hider local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0;
  size_type local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  local_3f8._M_string_length = 0;
  local_3f8.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_418 = local_408;
  local_420 = &response->data;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_418,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_3b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_458);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_438);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_418,local_410 + (long)local_418);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_3d8.field_2._M_allocated_capacity = *psVar13;
    local_3d8.field_2._8_8_ = plVar8[3];
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  }
  else {
    local_3d8.field_2._M_allocated_capacity = *psVar13;
    local_3d8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_3d8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_3d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_438,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"ListUnCompleteTasks","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->drds_instance_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"DrdsInstanceId","");
    pcVar2 = (req->drds_instance_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->drds_instance_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->db_name)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"DbName","");
    pcVar2 = (req->db_name)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (req->db_name)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_3b8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_3f8);
    if (((0 < iVar4) && (local_3f8._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_3f8,&local_438,true), bVar3)) {
      if (error_info != (DrdsErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_438,"RequestId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_438,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_3b8,pVVar10);
        }
        else {
          local_3b8._0_8_ = local_3b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3b8,anon_var_dwarf_179587 + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_3b8);
        pcVar2 = local_3b8 + 0x10;
        if ((pointer)local_3b8._0_8_ != pcVar2) {
          operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_438,"Code");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_438,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_3b8,pVVar10);
        }
        else {
          local_3b8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3b8,anon_var_dwarf_179587 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_3b8);
        if ((pointer)local_3b8._0_8_ != pcVar2) {
          operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_438,"HostId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_438,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_3b8,pVVar10);
        }
        else {
          local_3b8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3b8,anon_var_dwarf_179587 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_3b8);
        if ((pointer)local_3b8._0_8_ != pcVar2) {
          operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_438,"Message");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_438,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_3b8,pVVar10);
        }
        else {
          local_3b8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3b8,anon_var_dwarf_179587 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_3b8);
        if ((pointer)local_3b8._0_8_ != pcVar2) {
          operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
        }
      }
      if ((local_420 !=
           (vector<aliyun::DrdsListUnCompleteTaskstaskType,_std::allocator<aliyun::DrdsListUnCompleteTaskstaskType>_>
            *)0x0 && iVar4 == 200) && (bVar3 = Json::Value::isMember(&local_438,"Data"), bVar3)) {
        pVVar10 = Json::Value::operator[](&local_438,"Data");
        bVar3 = Json::Value::isMember(pVVar10,"task");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_438,"Data");
          pVVar10 = Json::Value::operator[](pVVar10,"task");
          bVar3 = Json::Value::isArray(pVVar10);
          if ((bVar3) && (AVar5 = Json::Value::size(pVVar10), AVar5 != 0)) {
            index = 0;
            do {
              local_3b8._0_8_ = local_3b8 + 0x10;
              local_3b8._8_8_ = 0;
              local_3b8[0x10] = '\0';
              local_398._M_p = (pointer)&local_388;
              local_390 = 0;
              local_388._M_local_buf[0] = '\0';
              local_378._M_p = (pointer)&local_368;
              local_370 = 0;
              local_368._M_local_buf[0] = '\0';
              local_350._M_p = (pointer)&local_340;
              local_348 = 0;
              local_340._M_local_buf[0] = '\0';
              local_328._M_p = (pointer)&local_318;
              local_320 = 0;
              local_318._M_local_buf[0] = '\0';
              local_300._M_p = (pointer)&local_2f0;
              local_2f8 = 0;
              local_2f0._M_local_buf[0] = '\0';
              local_2e0._M_p = (pointer)&local_2d0;
              local_2d8 = 0;
              local_2d0._M_local_buf[0] = '\0';
              pVVar11 = Json::Value::operator[](pVVar10,index);
              bVar3 = Json::Value::isMember(pVVar11,"RequestId");
              if (bVar3) {
                pVVar12 = Json::Value::operator[](pVVar11,"RequestId");
                Json::Value::asString_abi_cxx11_(&local_458,pVVar12);
                std::__cxx11::string::operator=((string *)local_3b8,(string *)&local_458);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_458._M_dataplus._M_p != &local_458.field_2) {
                  operator_delete(local_458._M_dataplus._M_p,
                                  local_458.field_2._M_allocated_capacity + 1);
                }
              }
              bVar3 = Json::Value::isMember(pVVar11,"TargetId");
              if (bVar3) {
                pVVar12 = Json::Value::operator[](pVVar11,"TargetId");
                Json::Value::asString_abi_cxx11_(&local_458,pVVar12);
                std::__cxx11::string::operator=((string *)&local_398,(string *)&local_458);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_458._M_dataplus._M_p != &local_458.field_2) {
                  operator_delete(local_458._M_dataplus._M_p,
                                  local_458.field_2._M_allocated_capacity + 1);
                }
              }
              bVar3 = Json::Value::isMember(pVVar11,"TaskDetail");
              if (bVar3) {
                pVVar12 = Json::Value::operator[](pVVar11,"TaskDetail");
                Json::Value::asString_abi_cxx11_(&local_458,pVVar12);
                std::__cxx11::string::operator=((string *)&local_378,(string *)&local_458);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_458._M_dataplus._M_p != &local_458.field_2) {
                  operator_delete(local_458._M_dataplus._M_p,
                                  local_458.field_2._M_allocated_capacity + 1);
                }
              }
              bVar3 = Json::Value::isMember(pVVar11,"taskStatus");
              if (bVar3) {
                pVVar12 = Json::Value::operator[](pVVar11,"taskStatus");
                local_358 = Json::Value::asInt(pVVar12);
              }
              bVar3 = Json::Value::isMember(pVVar11,"TaskPhase");
              if (bVar3) {
                pVVar12 = Json::Value::operator[](pVVar11,"TaskPhase");
                Json::Value::asString_abi_cxx11_(&local_458,pVVar12);
                std::__cxx11::string::operator=((string *)&local_350,(string *)&local_458);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_458._M_dataplus._M_p != &local_458.field_2) {
                  operator_delete(local_458._M_dataplus._M_p,
                                  local_458.field_2._M_allocated_capacity + 1);
                }
              }
              bVar3 = Json::Value::isMember(pVVar11,"TaskType");
              if (bVar3) {
                pVVar12 = Json::Value::operator[](pVVar11,"TaskType");
                local_330 = Json::Value::asInt(pVVar12);
              }
              bVar3 = Json::Value::isMember(pVVar11,"TaskName");
              if (bVar3) {
                pVVar12 = Json::Value::operator[](pVVar11,"TaskName");
                Json::Value::asString_abi_cxx11_(&local_458,pVVar12);
                std::__cxx11::string::operator=((string *)&local_328,(string *)&local_458);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_458._M_dataplus._M_p != &local_458.field_2) {
                  operator_delete(local_458._M_dataplus._M_p,
                                  local_458.field_2._M_allocated_capacity + 1);
                }
              }
              bVar3 = Json::Value::isMember(pVVar11,"gmtCreate");
              if (bVar3) {
                pVVar12 = Json::Value::operator[](pVVar11,"gmtCreate");
                IVar6 = Json::Value::asInt(pVVar12);
                local_308 = (long)IVar6;
              }
              bVar3 = Json::Value::isMember(pVVar11,"AllowCancel");
              if (bVar3) {
                pVVar12 = Json::Value::operator[](pVVar11,"AllowCancel");
                Json::Value::asString_abi_cxx11_(&local_458,pVVar12);
                std::__cxx11::string::operator=((string *)&local_300,(string *)&local_458);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_458._M_dataplus._M_p != &local_458.field_2) {
                  operator_delete(local_458._M_dataplus._M_p,
                                  local_458.field_2._M_allocated_capacity + 1);
                }
              }
              bVar3 = Json::Value::isMember(pVVar11,"ErrMsg");
              if (bVar3) {
                pVVar11 = Json::Value::operator[](pVVar11,"ErrMsg");
                Json::Value::asString_abi_cxx11_(&local_458,pVVar11);
                std::__cxx11::string::operator=((string *)&local_2e0,(string *)&local_458);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_458._M_dataplus._M_p != &local_458.field_2) {
                  operator_delete(local_458._M_dataplus._M_p,
                                  local_458.field_2._M_allocated_capacity + 1);
                }
              }
              std::
              vector<aliyun::DrdsListUnCompleteTaskstaskType,_std::allocator<aliyun::DrdsListUnCompleteTaskstaskType>_>
              ::push_back(local_420,(value_type *)local_3b8);
              DrdsListUnCompleteTaskstaskType::~DrdsListUnCompleteTaskstaskType
                        ((DrdsListUnCompleteTaskstaskType *)local_3b8);
              AVar5 = Json::Value::size(pVVar10);
              index = index + 1;
            } while (index < AVar5);
          }
        }
      }
      goto LAB_0013714b;
    }
    if (error_info == (DrdsErrorInfo *)0x0) goto LAB_00137146;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (DrdsErrorInfo *)0x0) {
LAB_00137146:
      iVar4 = -1;
      goto LAB_0013714b;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_0013714b:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_438);
  if (local_418 != local_408) {
    operator_delete(local_418,local_408[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                             local_3f8.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Drds::ListUnCompleteTasks(const DrdsListUnCompleteTasksRequestType& req,
                      DrdsListUnCompleteTasksResponseType* response,
                       DrdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","ListUnCompleteTasks");
  if(!req.drds_instance_id.empty()) {
    req_rpc->AddRequestQuery("DrdsInstanceId", req.drds_instance_id);
  }
  if(!req.db_name.empty()) {
    req_rpc->AddRequestQuery("DbName", req.db_name);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}